

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_functor::unary_op_log10>(Mat *a,Option *opt)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  long *in_RDI;
  float fVar6;
  ulong uVar7;
  float fVar9;
  float fVar10;
  undefined1 auVar8 [16];
  ulong uVar11;
  float fVar12;
  __m128 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_log10 op;
  Mat *m;
  v4sf y;
  v4sf z;
  v4sf tmp;
  v4sf mask;
  v4sf e;
  v4sf invalid_mask;
  v4sf one;
  v4si emm0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  int local_8d4;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8c0;
  undefined4 local_8b8;
  long local_8b0;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined8 local_890;
  undefined1 (*local_888) [12];
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  int local_868;
  undefined1 local_861 [9];
  long *local_858;
  undefined1 local_84d;
  int local_84c;
  undefined8 *local_840;
  undefined8 *local_838;
  undefined8 *local_828;
  undefined1 (*local_820) [12];
  undefined8 local_818;
  undefined8 uStack_810;
  undefined1 (*local_808) [12];
  long local_800;
  undefined4 local_7f4;
  long local_7f0;
  undefined1 (*local_7e8) [12];
  undefined4 local_7dc;
  int local_7d8;
  int local_7d4;
  undefined8 *local_7d0;
  undefined4 local_7c4;
  long local_7c0;
  undefined8 *local_7b0;
  undefined8 *local_788;
  undefined1 *local_780;
  undefined4 local_778;
  undefined4 uStack_774;
  undefined4 uStack_770;
  undefined4 uStack_76c;
  undefined4 local_768;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  float local_728;
  float fStack_724;
  float fStack_720;
  float fStack_71c;
  ulong local_718;
  ulong uStack_710;
  int local_708;
  int iStack_704;
  int iStack_700;
  int iStack_6fc;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  int local_6e8;
  int iStack_6e4;
  int iStack_6e0;
  int iStack_6dc;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  int local_6c8;
  int iStack_6c4;
  int iStack_6c0;
  int iStack_6bc;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  ulong local_6a8;
  ulong uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  ulong local_688;
  ulong uStack_680;
  ulong local_678;
  ulong uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  ulong local_658;
  ulong uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  ulong local_618;
  ulong uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  ulong local_5c8;
  ulong uStack_5c0;
  ulong local_5b8;
  ulong uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  ulong local_598;
  ulong uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 *local_4a0;
  float *local_498;
  float *local_490;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined8 local_478;
  undefined8 uStack_470;
  float local_468 [2];
  float afStack_460 [2];
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 *local_440;
  float *local_438;
  float *local_430;
  float local_428 [2];
  float afStack_420 [2];
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  undefined8 *local_3e0;
  float *local_3d8;
  float *local_3d0;
  float local_3c8 [2];
  float afStack_3c0 [2];
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  float local_348 [2];
  float afStack_340 [2];
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float *local_320;
  undefined8 *local_318;
  undefined8 *local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  float local_2e8 [2];
  float afStack_2e0 [2];
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float *local_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  float local_288 [2];
  float afStack_280 [2];
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float *local_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  float local_228 [2];
  float afStack_220 [2];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  float local_1c8 [2];
  float afStack_1c0 [2];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168 [2];
  float afStack_160 [2];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float *local_140;
  undefined8 *local_138;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108 [2];
  float afStack_100 [2];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8 [2];
  float afStack_a0 [2];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  ulong uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 (*local_10) [12];
  undefined1 *local_8;
  
  local_868 = *(int *)((long)in_RDI + 0x2c);
  local_86c = (int)in_RDI[6];
  local_870 = *(int *)((long)in_RDI + 0x34);
  local_874 = (int)in_RDI[7];
  local_878 = (int)in_RDI[3];
  local_87c = local_868 * local_86c * local_870 * local_878;
  local_858 = in_RDI;
  for (local_880 = 0; local_880 < local_874; local_880 = local_880 + 1) {
    local_840 = &local_8d0;
    local_7d4 = *(int *)((long)local_858 + 0x2c);
    local_7d8 = (int)local_858[6];
    local_7dc = *(undefined4 *)((long)local_858 + 0x34);
    local_7e8 = (undefined1 (*) [12])(*local_858 + local_858[8] * (long)local_880 * local_858[2]);
    local_7f0 = local_858[2];
    local_7f4 = (undefined4)local_858[3];
    local_800 = local_858[4];
    local_7d0 = &local_8d0;
    local_7c0 = (long)local_7d4 * (long)local_7d8 * local_7f0;
    local_838 = &local_8d0;
    local_828 = &local_8d0;
    local_7c4 = 0x10;
    local_84c = local_880;
    local_84d = 1;
    local_8d0 = 0;
    local_8c0 = 0;
    local_8b8 = 0;
    local_8a8 = 0;
    local_8a4 = 0;
    local_8a0 = 0;
    local_89c = 0;
    local_898 = 0;
    local_890 = 0;
    local_8c8 = 0;
    local_888 = local_7e8;
    for (local_8d4 = 0; fVar9 = uStack_8e0._4_4_, fVar6 = local_8e8._4_4_, uVar4 = local_8e8,
        uVar5 = uStack_8e0, local_7b0 = local_828, local_8e8._4_4_ = fVar6, uStack_8e0._4_4_ = fVar9
        , local_8b0 = local_800, local_8d4 + 3 < local_87c; local_8d4 = local_8d4 + 4) {
      local_820 = local_888;
      local_518 = *(undefined8 *)*local_888;
      uStack_510 = *(undefined8 *)(*local_888 + 8);
      uStack_8e0._4_4_ = (float)((ulong)uStack_510 >> 0x20);
      local_780 = local_861;
      local_788 = &local_8e8;
      auVar3._12_4_ = uStack_8e0._4_4_;
      auVar3._0_12_ = *local_888;
      local_6d8 = 0x3f8000003f800000;
      uStack_6d0 = 0x3f8000003f800000;
      local_608 = 0;
      uStack_600 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_78._0_4_ = (float)local_518;
      local_78._4_4_ = (float)((ulong)local_518 >> 0x20);
      uStack_70._0_4_ = (float)uStack_510;
      local_6e8 = -(uint)((float)local_78 <= 0.0);
      iStack_6e4 = -(uint)(local_78._4_4_ <= 0.0);
      iStack_6e0 = -(uint)((float)uStack_70 <= 0.0);
      iStack_6dc = -(uint)(uStack_8e0._4_4_ <= 0.0);
      local_528 = 0x80000000800000;
      uStack_520 = 0x80000000800000;
      auVar8._8_8_ = 0x80000000800000;
      auVar8._0_8_ = 0x80000000800000;
      auVar8 = maxps(auVar3,auVar8);
      local_6b8 = auVar8._0_8_;
      local_48 = local_6b8;
      uStack_6b0 = auVar8._8_8_;
      uStack_40 = uStack_6b0;
      uVar1 = local_6b8;
      uVar2 = uStack_6b0;
      local_5c = 0x17;
      local_58._0_4_ = auVar8._0_4_;
      local_58._4_4_ = auVar8._4_4_;
      uStack_50._0_4_ = auVar8._8_4_;
      uStack_50._4_4_ = auVar8._12_4_;
      local_658 = local_6b8;
      uStack_650 = uStack_6b0;
      local_668 = 0x807fffff807fffff;
      uStack_660 = 0x807fffff807fffff;
      local_598 = local_6b8 & 0x807fffff807fffff;
      uStack_590 = uStack_6b0 & 0x807fffff807fffff;
      local_5a8 = 0x3f0000003f000000;
      uStack_5a0 = 0x3f0000003f000000;
      local_678 = local_598 | 0x3f0000003f000000;
      uStack_670 = uStack_590 | 0x3f0000003f000000;
      local_28 = CONCAT44(local_58._4_4_ >> 0x17,(uint)local_58 >> 0x17);
      uStack_20 = CONCAT44(uStack_50._4_4_ >> 0x17,(uint)uStack_50 >> 0x17);
      local_38 = 0x7f0000007f;
      uStack_30 = 0x7f0000007f;
      local_6c8 = ((uint)local_58 >> 0x17) - 0x7f;
      iStack_6c4 = (local_58._4_4_ >> 0x17) - 0x7f;
      iStack_6c0 = ((uint)uStack_50 >> 0x17) - 0x7f;
      iStack_6bc = (uStack_50._4_4_ >> 0x17) - 0x7f;
      local_5d8 = CONCAT44(iStack_6c4,local_6c8);
      uStack_5d0 = CONCAT44(iStack_6bc,iStack_6c0);
      local_4b8 = CONCAT44((float)iStack_6c4,(float)local_6c8);
      uStack_4b0 = CONCAT44((float)iStack_6bc,(float)iStack_6c0);
      local_4c8 = 0x3f8000003f800000;
      uStack_4c0 = 0x3f8000003f800000;
      local_6f8 = (float)local_6c8 + 1.0;
      fStack_6f4 = (float)iStack_6c4 + 1.0;
      fStack_6f0 = (float)iStack_6c0 + 1.0;
      fStack_6ec = (float)iStack_6bc + 1.0;
      local_5f8 = 0x3f3504f33f3504f3;
      uStack_5f0 = 0x3f3504f33f3504f3;
      local_5e8._0_4_ = (float)local_678;
      local_5e8._4_4_ = (float)(local_678 >> 0x20);
      uStack_5e0._0_4_ = (float)uStack_670;
      uStack_5e0._4_4_ = (float)(uStack_670 >> 0x20);
      local_708 = -(uint)((float)local_5e8 < 0.70710677);
      iStack_704 = -(uint)(local_5e8._4_4_ < 0.70710677);
      iStack_700 = -(uint)((float)uStack_5e0 < 0.70710677);
      iStack_6fc = -(uint)(uStack_5e0._4_4_ < 0.70710677);
      local_688 = CONCAT44(iStack_704,local_708);
      uStack_680 = CONCAT44(iStack_6fc,iStack_700);
      local_718 = local_678 & local_688;
      uStack_710 = uStack_670 & uStack_680;
      local_628 = 0x3f8000003f800000;
      uStack_620 = 0x3f8000003f800000;
      local_6b8 = CONCAT44(local_5e8._4_4_ - 1.0,(float)local_5e8 - 1.0);
      uStack_6b0._0_4_ = (float)uStack_5e0 - 1.0;
      uStack_6b0._4_4_ = uStack_5e0._4_4_ - 1.0;
      local_638 = CONCAT44(fStack_6f4,local_6f8);
      uStack_630 = CONCAT44(fStack_6ec,fStack_6f0);
      local_698 = 0x3f8000003f800000;
      uStack_690 = 0x3f8000003f800000;
      local_6a8 = CONCAT44(iStack_704,local_708);
      uStack_6a0 = CONCAT44(iStack_6fc,iStack_700);
      uVar7 = local_6a8 & 0x3f8000003f800000;
      uVar11 = uStack_6a0 & 0x3f8000003f800000;
      local_648._0_4_ = (float)uVar7;
      local_648._4_4_ = (float)(uVar7 >> 0x20);
      uStack_640._0_4_ = (float)uVar11;
      uStack_640._4_4_ = (float)(uVar11 >> 0x20);
      local_6f8 = local_6f8 - (float)local_648;
      fStack_6f4 = fStack_6f4 - local_648._4_4_;
      fStack_6f0 = fStack_6f0 - (float)uStack_640;
      fStack_6ec = fStack_6ec - uStack_640._4_4_;
      local_4d8 = local_6b8;
      uStack_4d0 = uStack_6b0;
      local_4e8._0_4_ = (float)local_718;
      local_4e8._4_4_ = (float)(local_718 >> 0x20);
      uStack_4e0._0_4_ = (float)uStack_710;
      uStack_4e0._4_4_ = (float)(uStack_710 >> 0x20);
      local_4e8._0_4_ = ((float)local_5e8 - 1.0) + (float)local_4e8;
      local_4e8._4_4_ = (local_5e8._4_4_ - 1.0) + local_4e8._4_4_;
      uStack_4e0._0_4_ = ((float)uStack_5e0 - 1.0) + (float)uStack_4e0;
      uStack_4e0._4_4_ = (uStack_5e0._4_4_ - 1.0) + uStack_4e0._4_4_;
      local_6b8 = CONCAT44(local_4e8._4_4_,(float)local_4e8);
      uStack_6b0._0_4_ = (float)uStack_4e0;
      uStack_6b0._4_4_ = uStack_4e0._4_4_;
      local_548 = local_6b8;
      uStack_540 = uStack_6b0;
      local_728 = (float)local_4e8 * (float)local_4e8;
      fStack_724 = local_4e8._4_4_ * local_4e8._4_4_;
      fStack_720 = (float)uStack_4e0 * (float)uStack_4e0;
      fStack_71c = uStack_4e0._4_4_ * uStack_4e0._4_4_;
      local_4a0 = &local_738;
      local_440 = &local_6b8;
      local_e0 = ::_ps_cephes_log_p1;
      local_b8 = 0x3d9021bb3d9021bb;
      uStack_b0 = 0x3d9021bb3d9021bb;
      local_c8 = local_6b8;
      uStack_c0 = uStack_6b0;
      local_98 = (float)local_4e8 * 0.070376836;
      fStack_94 = local_4e8._4_4_ * 0.070376836;
      fStack_90 = (float)uStack_4e0 * 0.070376836;
      fStack_8c = uStack_4e0._4_4_ * 0.070376836;
      local_a8[0] = -0.1151461;
      local_a8[1] = -0.1151461;
      afStack_a0[0] = -0.1151461;
      afStack_a0[1] = -0.1151461;
      local_738 = CONCAT44(fStack_94 + -0.1151461,local_98 + -0.1151461);
      uStack_730 = CONCAT44(fStack_8c + -0.1151461,fStack_90 + -0.1151461);
      local_140 = ::_ps_cephes_log_p2;
      local_118 = local_738;
      uStack_110 = uStack_730;
      local_128 = local_6b8;
      uStack_120 = uStack_6b0;
      local_f8 = (local_98 + -0.1151461) * (float)local_4e8;
      fStack_f4 = (fStack_94 + -0.1151461) * local_4e8._4_4_;
      fStack_f0 = (fStack_90 + -0.1151461) * (float)uStack_4e0;
      fStack_ec = (fStack_8c + -0.1151461) * uStack_4e0._4_4_;
      local_108[0] = 0.116769984;
      local_108[1] = 0.116769984;
      afStack_100[0] = 0.116769984;
      afStack_100[1] = 0.116769984;
      local_738 = CONCAT44(fStack_f4 + 0.116769984,local_f8 + 0.116769984);
      uStack_730 = CONCAT44(fStack_ec + 0.116769984,fStack_f0 + 0.116769984);
      local_1a0 = ::_ps_cephes_log_p3;
      local_178 = local_738;
      uStack_170 = uStack_730;
      local_188 = local_6b8;
      uStack_180 = uStack_6b0;
      local_158 = (local_f8 + 0.116769984) * (float)local_4e8;
      fStack_154 = (fStack_f4 + 0.116769984) * local_4e8._4_4_;
      fStack_150 = (fStack_f0 + 0.116769984) * (float)uStack_4e0;
      fStack_14c = (fStack_ec + 0.116769984) * uStack_4e0._4_4_;
      local_168[0] = -0.12420141;
      local_168[1] = -0.12420141;
      afStack_160[0] = -0.12420141;
      afStack_160[1] = -0.12420141;
      local_738 = CONCAT44(fStack_154 + -0.12420141,local_158 + -0.12420141);
      uStack_730 = CONCAT44(fStack_14c + -0.12420141,fStack_150 + -0.12420141);
      local_200 = ::_ps_cephes_log_p4;
      local_1d8 = local_738;
      uStack_1d0 = uStack_730;
      local_1e8 = local_6b8;
      uStack_1e0 = uStack_6b0;
      local_1b8 = (local_158 + -0.12420141) * (float)local_4e8;
      fStack_1b4 = (fStack_154 + -0.12420141) * local_4e8._4_4_;
      fStack_1b0 = (fStack_150 + -0.12420141) * (float)uStack_4e0;
      fStack_1ac = (fStack_14c + -0.12420141) * uStack_4e0._4_4_;
      local_1c8[0] = 0.14249323;
      local_1c8[1] = 0.14249323;
      afStack_1c0[0] = 0.14249323;
      afStack_1c0[1] = 0.14249323;
      local_738 = CONCAT44(fStack_1b4 + 0.14249323,local_1b8 + 0.14249323);
      uStack_730 = CONCAT44(fStack_1ac + 0.14249323,fStack_1b0 + 0.14249323);
      local_260 = ::_ps_cephes_log_p5;
      local_238 = local_738;
      uStack_230 = uStack_730;
      local_248 = local_6b8;
      uStack_240 = uStack_6b0;
      local_218 = (local_1b8 + 0.14249323) * (float)local_4e8;
      fStack_214 = (fStack_1b4 + 0.14249323) * local_4e8._4_4_;
      fStack_210 = (fStack_1b0 + 0.14249323) * (float)uStack_4e0;
      fStack_20c = (fStack_1ac + 0.14249323) * uStack_4e0._4_4_;
      local_228[0] = -0.16668057;
      local_228[1] = -0.16668057;
      afStack_220[0] = -0.16668057;
      afStack_220[1] = -0.16668057;
      local_738 = CONCAT44(fStack_214 + -0.16668057,local_218 + -0.16668057);
      uStack_730 = CONCAT44(fStack_20c + -0.16668057,fStack_210 + -0.16668057);
      local_2c0 = ::_ps_cephes_log_p6;
      local_298 = local_738;
      uStack_290 = uStack_730;
      local_2a8 = local_6b8;
      uStack_2a0 = uStack_6b0;
      local_278 = (local_218 + -0.16668057) * (float)local_4e8;
      fStack_274 = (fStack_214 + -0.16668057) * local_4e8._4_4_;
      fStack_270 = (fStack_210 + -0.16668057) * (float)uStack_4e0;
      fStack_26c = (fStack_20c + -0.16668057) * uStack_4e0._4_4_;
      local_288[0] = 0.20000714;
      local_288[1] = 0.20000714;
      afStack_280[0] = 0.20000714;
      afStack_280[1] = 0.20000714;
      local_738 = CONCAT44(fStack_274 + 0.20000714,local_278 + 0.20000714);
      uStack_730 = CONCAT44(fStack_26c + 0.20000714,fStack_270 + 0.20000714);
      local_320 = ::_ps_cephes_log_p7;
      local_2f8 = local_738;
      uStack_2f0 = uStack_730;
      local_308 = local_6b8;
      uStack_300 = uStack_6b0;
      local_2d8 = (local_278 + 0.20000714) * (float)local_4e8;
      fStack_2d4 = (fStack_274 + 0.20000714) * local_4e8._4_4_;
      fStack_2d0 = (fStack_270 + 0.20000714) * (float)uStack_4e0;
      fStack_2cc = (fStack_26c + 0.20000714) * uStack_4e0._4_4_;
      local_2e8[0] = -0.24999994;
      local_2e8[1] = -0.24999994;
      afStack_2e0[0] = -0.24999994;
      afStack_2e0[1] = -0.24999994;
      local_738 = CONCAT44(fStack_2d4 + -0.24999994,local_2d8 + -0.24999994);
      uStack_730 = CONCAT44(fStack_2cc + -0.24999994,fStack_2d0 + -0.24999994);
      local_380 = ::_ps_cephes_log_p8;
      local_358 = local_738;
      uStack_350 = uStack_730;
      local_368 = local_6b8;
      uStack_360 = uStack_6b0;
      local_338 = (local_2d8 + -0.24999994) * (float)local_4e8;
      fStack_334 = (fStack_2d4 + -0.24999994) * local_4e8._4_4_;
      fStack_330 = (fStack_2d0 + -0.24999994) * (float)uStack_4e0;
      fStack_32c = (fStack_2cc + -0.24999994) * uStack_4e0._4_4_;
      local_348[0] = 0.3333333;
      local_348[1] = 0.3333333;
      afStack_340[0] = 0.3333333;
      afStack_340[1] = 0.3333333;
      local_738 = CONCAT44(fStack_334 + 0.3333333,local_338 + 0.3333333);
      uStack_730 = CONCAT44(fStack_32c + 0.3333333,fStack_330 + 0.3333333);
      local_558 = local_738;
      uStack_550 = uStack_730;
      local_568 = local_6b8;
      uStack_560 = uStack_6b0;
      fVar6 = (local_338 + 0.3333333) * (float)local_4e8;
      fVar9 = (fStack_334 + 0.3333333) * local_4e8._4_4_;
      fVar10 = (fStack_330 + 0.3333333) * (float)uStack_4e0;
      fVar12 = (fStack_32c + 0.3333333) * uStack_4e0._4_4_;
      local_738 = CONCAT44(fVar9,fVar6);
      uStack_730 = CONCAT44(fVar12,fVar10);
      local_578 = local_738;
      uStack_570 = uStack_730;
      local_588 = CONCAT44(fStack_724,local_728);
      uStack_580 = CONCAT44(fStack_71c,fStack_720);
      fVar6 = fVar6 * local_728;
      fVar9 = fVar9 * fStack_724;
      fVar10 = fVar10 * fStack_720;
      fVar12 = fVar12 * fStack_71c;
      local_738 = CONCAT44(fVar9,fVar6);
      uStack_730 = CONCAT44(fVar12,fVar10);
      local_430 = &local_6f8;
      local_3d8 = ::_ps_cephes_log_q1;
      local_3b8 = CONCAT44(fStack_6f4,local_6f8);
      uStack_3b0 = CONCAT44(fStack_6ec,fStack_6f0);
      local_3c8[0] = -0.00021219444;
      local_3c8[1] = -0.00021219444;
      afStack_3c0[0] = -0.00021219444;
      afStack_3c0[1] = -0.00021219444;
      local_398 = local_6f8 * -0.00021219444;
      fStack_394 = fStack_6f4 * -0.00021219444;
      fStack_390 = fStack_6f0 * -0.00021219444;
      fStack_38c = fStack_6ec * -0.00021219444;
      local_3a8 = local_738;
      uStack_3a0 = uStack_730;
      fVar6 = local_398 + fVar6;
      fVar9 = fStack_394 + fVar9;
      fVar10 = fStack_390 + fVar10;
      fVar12 = fStack_38c + fVar12;
      local_738 = CONCAT44(fVar9,fVar6);
      uStack_730 = CONCAT44(fVar12,fVar10);
      local_490 = &local_728;
      local_498 = ::_ps_0p5;
      local_478 = local_738;
      uStack_470 = uStack_730;
      local_458 = CONCAT44(fStack_724,local_728);
      uStack_450 = CONCAT44(fStack_71c,fStack_720);
      local_468[0] = 0.5;
      local_468[1] = 0.5;
      afStack_460[0] = 0.5;
      afStack_460[1] = 0.5;
      local_488 = local_728 * 0.5;
      fStack_484 = fStack_724 * 0.5;
      fStack_480 = fStack_720 * 0.5;
      fStack_47c = fStack_71c * 0.5;
      fVar6 = fVar6 - local_488;
      fVar9 = fVar9 - fStack_484;
      fVar10 = fVar10 - fStack_480;
      fVar12 = fVar12 - fStack_47c;
      local_738 = CONCAT44(fVar9,fVar6);
      uStack_730 = CONCAT44(fVar12,fVar10);
      local_4f8 = local_6b8;
      uStack_4f0 = uStack_6b0;
      local_508 = local_738;
      uStack_500 = uStack_730;
      local_4e8._0_4_ = (float)local_4e8 + fVar6;
      local_4e8._4_4_ = local_4e8._4_4_ + fVar9;
      uStack_4e0._0_4_ = (float)uStack_4e0 + fVar10;
      uStack_4e0._4_4_ = uStack_4e0._4_4_ + fVar12;
      local_6b8 = CONCAT44(local_4e8._4_4_,(float)local_4e8);
      uStack_6b0._0_4_ = (float)uStack_4e0;
      uStack_6b0._4_4_ = uStack_4e0._4_4_;
      local_438 = ::_ps_cephes_log_q2;
      local_418 = CONCAT44(fStack_6f4,local_6f8);
      uStack_410 = CONCAT44(fStack_6ec,fStack_6f0);
      local_428[0] = 0.6933594;
      local_428[1] = 0.6933594;
      afStack_420[0] = 0.6933594;
      afStack_420[1] = 0.6933594;
      local_3f8 = local_6f8 * 0.6933594;
      fStack_3f4 = fStack_6f4 * 0.6933594;
      fStack_3f0 = fStack_6f0 * 0.6933594;
      fStack_3ec = fStack_6ec * 0.6933594;
      local_408 = local_6b8;
      uStack_400 = uStack_6b0;
      local_6b8 = CONCAT44(fStack_3f4 + local_4e8._4_4_,local_3f8 + (float)local_4e8);
      uStack_6b0._0_4_ = fStack_3f0 + (float)uStack_4e0;
      uStack_6b0._4_4_ = fStack_3ec + uStack_4e0._4_4_;
      local_5b8 = local_6b8;
      uStack_5b0 = uStack_6b0;
      local_5c8 = CONCAT44(iStack_6e4,local_6e8);
      uStack_5c0 = CONCAT44(iStack_6dc,iStack_6e0);
      local_6b8 = local_6b8 | local_5c8;
      uStack_6b0 = uStack_6b0 | uStack_5c0;
      local_768 = 0x3ede5bd9;
      local_778 = 0x3ede5bd9;
      local_758 = 0x3ede5bd93ede5bd9;
      uStack_750 = 0x3ede5bd93ede5bd9;
      local_748._0_4_ = (float)local_6b8;
      local_748._4_4_ = (float)(local_6b8 >> 0x20);
      uStack_740._0_4_ = (float)uStack_6b0;
      uStack_740._4_4_ = (float)(uStack_6b0 >> 0x20);
      local_8e8._4_4_ = local_748._4_4_ * 0.4342945;
      uStack_8e0._4_4_ = uStack_740._4_4_ * 0.4342945;
      local_8e8 = CONCAT44(local_8e8._4_4_,(float)local_748 * 0.4342945);
      uStack_8e0 = CONCAT44(uStack_8e0._4_4_,(float)uStack_740 * 0.4342945);
      local_808 = local_888;
      *(float *)*local_888 = (float)local_748 * 0.4342945;
      *(float *)(*local_888 + 4) = local_8e8._4_4_;
      *(float *)(*local_888 + 8) = (float)uStack_740 * 0.4342945;
      *(float *)local_888[1] = uStack_8e0._4_4_;
      local_888 = (undefined1 (*) [12])(local_888[1] + 4);
      local_818 = local_8e8;
      uStack_810 = uStack_8e0;
      uStack_774 = local_778;
      uStack_770 = local_778;
      uStack_76c = local_778;
      local_748 = local_6b8;
      uStack_740 = uStack_6b0;
      local_648 = uVar7;
      uStack_640 = uVar11;
      local_618 = local_678;
      uStack_610 = uStack_670;
      local_5e8 = local_678;
      uStack_5e0 = uStack_670;
      local_538 = local_548;
      uStack_530 = uStack_540;
      local_4e8 = local_718;
      uStack_4e0 = uStack_710;
      local_3e0 = local_4a0;
      local_3d0 = local_430;
      local_378 = local_440;
      local_370 = local_4a0;
      local_318 = local_440;
      local_310 = local_4a0;
      local_2b8 = local_440;
      local_2b0 = local_4a0;
      local_258 = local_440;
      local_250 = local_4a0;
      local_1f8 = local_440;
      local_1f0 = local_4a0;
      local_198 = local_440;
      local_190 = local_4a0;
      local_138 = local_440;
      local_130 = local_4a0;
      local_d8 = local_440;
      local_d0 = local_4a0;
      local_78 = local_518;
      uStack_70 = uStack_510;
      local_58 = uVar1;
      uStack_50 = uVar2;
    }
    for (; uStack_8e0 = uVar5, local_8e8 = uVar4, fVar9 = uStack_8e0._4_4_, fVar6 = local_8e8._4_4_,
        local_8d4 < local_87c; local_8d4 = local_8d4 + 1) {
      local_8 = local_861;
      local_10 = local_888;
      uVar4 = local_8e8;
      local_8e8._4_4_ = fVar6;
      uVar5 = uStack_8e0;
      uStack_8e0._4_4_ = fVar9;
      fVar6 = log10f(*(float *)*local_888);
      uVar5 = uStack_8e0;
      uVar4 = local_8e8;
      *(float *)*local_888 = fVar6;
      local_888 = (undefined1 (*) [12])(*local_888 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}